

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitVarArg<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
          (ExprComparator *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
          e)

{
  bool bVar1;
  ExprBase other;
  long in_RDI;
  iterator jend;
  iterator j;
  iterator iend;
  iterator i;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  vararg;
  ExprBase in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  ExprBase in_stack_ffffffffffffff88;
  ExprBase in_stack_ffffffffffffff90;
  ExprBase e2;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_40;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_38;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_30;
  undefined8 local_28;
  BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45> local_20;
  
  local_28 = *(undefined8 *)(in_RDI + 8);
  local_20.super_ExprBase.impl_ =
       (ExprBase)
       mp::
       Cast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                 ((Expr)in_stack_ffffffffffffff78.impl_);
  local_30.ptr_ =
       (Impl **)mp::
                BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                         *)in_stack_ffffffffffffff78.impl_);
  local_38.ptr_ =
       (Impl **)mp::
                BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                ::end((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                       *)in_stack_ffffffffffffff88.impl_);
  local_40.ptr_ =
       (Impl **)mp::
                BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                         *)in_stack_ffffffffffffff78.impl_);
  other.impl_ = (Impl *)mp::
                        BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                        ::end((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                               *)in_stack_ffffffffffffff88.impl_);
  while( true ) {
    e2.impl_ = (Impl *)local_38.ptr_;
    bVar1 = mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
            operator!=(&local_30,local_38);
    if (!bVar1) {
      bVar1 = mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
              operator==(&local_40,
                         (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)
                         other.impl_);
      return bVar1;
    }
    bVar1 = mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
            operator==(&local_40,
                       (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)
                       other.impl_);
    if (bVar1) break;
    mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator*
              ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
               in_stack_ffffffffffffff78.impl_);
    mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffffff88.impl_,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff90.impl_,
               (type_conflict)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    in_stack_ffffffffffffff88.impl_ =
         (Impl *)mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                 operator*((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                           in_stack_ffffffffffffff78.impl_);
    mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffffff88.impl_,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff90.impl_,
               (type_conflict)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    bVar1 = mp::Equal((Expr)other.impl_,(Expr)e2.impl_);
    if (!bVar1) {
      return false;
    }
    mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
              (&local_30);
    mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
              (&local_40);
  }
  return false;
}

Assistant:

bool ExprComparator::VisitVarArg(E e) {
  E vararg = Cast<E>(expr_);
  typename E::iterator i = vararg.begin(), iend = vararg.end();
  typename E::iterator j = e.begin(), jend = e.end();
  for (; i != iend; ++i, ++j) {
    if (j == jend || !Equal(*i, *j))
      return false;
  }
  return j == jend;
}